

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
               (Nonzero<double> *keys,int end,ElementCompare *compare,int start)

{
  long lVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  
  lVar7 = 2;
  do {
    iVar3 = SPxShellsort<soplex::Nonzero<double>,_soplex::SPxMainSM<double>::ElementCompare>::incs
            [lVar7];
    lVar1 = (long)iVar3 + (long)start;
    lVar9 = lVar1;
    iVar6 = start;
    if ((int)lVar1 <= end) {
      do {
        dVar2 = keys[lVar9].val;
        iVar4 = keys[lVar9].idx;
        iVar8 = (int)lVar9;
        iVar5 = iVar6;
        if (lVar1 <= lVar9) {
          do {
            if ((ABS(dVar2 - keys[iVar5].val) <= compare->epsiloncompare) ||
               (keys[iVar5].val <= dVar2)) {
              iVar8 = iVar5 + iVar3;
              goto LAB_00222f6b;
            }
            keys[iVar3 + iVar5].idx = keys[iVar5].idx;
            keys[iVar3 + iVar5].val = keys[iVar5].val;
            iVar8 = iVar5 - iVar3;
            bVar10 = (int)lVar1 <= iVar5;
            iVar5 = iVar8;
          } while (bVar10);
          iVar8 = iVar8 + iVar3;
        }
LAB_00222f6b:
        keys[iVar8].val = dVar2;
        keys[iVar8].idx = iVar4;
        lVar9 = lVar9 + 1;
        iVar6 = iVar6 + 1;
      } while (end + 1 != (int)lVar9);
    }
    bVar10 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar10) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}